

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

optional<unsigned_int> __thiscall
google::protobuf::json_internal::anon_unknown_5::TakeTimeDigitsWithSuffixAndAdvance
          (anon_unknown_5 *this,string_view *data,int max_digits,string_view end)

{
  bool bVar1;
  string *psVar2;
  size_t sVar3;
  ulong uVar4;
  undefined4 in_register_00000014;
  char *pcVar5;
  uint uVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  string_view prefix;
  string_view text;
  LogMessageFatal local_40 [16];
  
  prefix._M_len = CONCAT44(in_register_00000014,max_digits);
  prefix._M_str = (char *)end._M_len;
  uVar4 = (ulong)data & 0xffffffff;
  psVar2 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_((int)data,9,"max_digits <= 9");
  if (psVar2 != (string *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/json/internal/parser.cc"
               ,0x2cf,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  uVar6 = 0;
  sVar3 = *(size_t *)this;
  while (sVar3 != 0) {
    if ((int)uVar4 < 0) goto LAB_00294278;
    pcVar5 = *(char **)(this + 8);
    if (9 < (int)*pcVar5 - 0x30U) goto LAB_0029423e;
    uVar6 = ((int)*pcVar5 - 0x30U) + uVar6 * 10;
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)this,1,0xffffffffffffffff
                      );
    *(basic_string_view<char,_std::char_traits<char>_> *)this = bVar7;
    uVar4 = (ulong)((int)uVar4 - 1);
    sVar3 = bVar7._M_len;
  }
  pcVar5 = *(char **)(this + 8);
LAB_0029423e:
  text._M_str = pcVar5;
  text._M_len = sVar3;
  bVar1 = absl::lts_20240722::StartsWith(text,prefix);
  if (bVar1) {
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)this,prefix._M_len,
                       0xffffffffffffffff);
    *(basic_string_view<char,_std::char_traits<char>_> *)this = bVar7;
    uVar4 = 0x100000000;
  }
  else {
LAB_00294278:
    uVar4 = 0;
  }
  return (optional<unsigned_int>)(uVar6 | uVar4);
}

Assistant:

absl::optional<uint32_t> TakeTimeDigitsWithSuffixAndAdvance(
    absl::string_view& data, int max_digits, absl::string_view end) {
  ABSL_DCHECK_LE(max_digits, 9);

  uint32_t val = 0;
  int limit = max_digits;
  while (!data.empty()) {
    if (limit-- < 0) {
      return absl::nullopt;
    }
    uint32_t digit = data[0] - '0';
    if (digit >= 10) {
      break;
    }

    val *= 10;
    val += digit;
    data = data.substr(1);
  }
  if (!absl::StartsWith(data, end)) {
    return absl::nullopt;
  }

  data = data.substr(end.size());
  return val;
}